

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramid.cc
# Opt level: O0

void __thiscall ParamIDAnalysis::saveXml(ParamIDAnalysis *this,ostream *s,bool moredetail)

{
  ParamMeasure *pPVar1;
  ostream *poVar2;
  bool bVar3;
  string *psVar4;
  Address *this_00;
  FuncProto *pFVar5;
  allocator local_179;
  string local_178 [32];
  ParamMeasure *local_158;
  ParamMeasure *pm_1;
  _List_node_base *local_148;
  allocator local_139;
  string local_138 [32];
  ParamMeasure *local_118;
  ParamMeasure *pm;
  _List_node_base *local_108;
  _List_const_iterator<ParamMeasure> local_100;
  const_iterator pm_iter;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  int4 local_80;
  allocator local_79;
  int4 extrapop;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  ostream *poStack_18;
  bool moredetail_local;
  ostream *s_local;
  ParamIDAnalysis *this_local;
  
  local_19 = moredetail;
  poStack_18 = s;
  s_local = (ostream *)this;
  std::operator<<(s,"<parammeasures");
  poVar2 = poStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"name",&local_41);
  psVar4 = Funcdata::getName_abi_cxx11_(this->fd);
  a_v(poVar2,(string *)local_40,psVar4);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::operator<<(poStack_18,">\n  ");
  this_00 = Funcdata::getAddress(this->fd);
  Address::saveXml(this_00,poStack_18);
  std::operator<<(poStack_18,"\n  <proto");
  poVar2 = poStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&extrapop,"model",&local_79);
  pFVar5 = Funcdata::getFuncProto(this->fd);
  psVar4 = FuncProto::getModelName_abi_cxx11_(pFVar5);
  a_v(poVar2,(string *)&extrapop,psVar4);
  std::__cxx11::string::~string((string *)&extrapop);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pFVar5 = Funcdata::getFuncProto(this->fd);
  local_80 = FuncProto::getExtraPop(pFVar5);
  poVar2 = poStack_18;
  if (local_80 == 0x8000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"extrapop",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"unknown",&local_c9);
    a_v(poVar2,(string *)local_a0,(string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"extrapop",(allocator *)((long)&pm_iter._M_node + 7));
    a_v_i(poVar2,(string *)local_f0,(long)local_80);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pm_iter._M_node + 7));
  }
  std::operator<<(poStack_18,"/>\n");
  std::_List_const_iterator<ParamMeasure>::_List_const_iterator(&local_100);
  local_108 = (_List_node_base *)
              std::__cxx11::list<ParamMeasure,_std::allocator<ParamMeasure>_>::begin
                        (&this->InputParamMeasures);
  local_100._M_node = local_108;
  while( true ) {
    pm = (ParamMeasure *)
         std::__cxx11::list<ParamMeasure,_std::allocator<ParamMeasure>_>::end
                   (&this->InputParamMeasures);
    bVar3 = std::operator!=(&local_100,(_Self *)&pm);
    if (!bVar3) break;
    local_118 = std::_List_const_iterator<ParamMeasure>::operator*(&local_100);
    std::operator<<(poStack_18,"  ");
    poVar2 = poStack_18;
    pPVar1 = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"input",&local_139);
    ParamMeasure::saveXml(pPVar1,poVar2,(string *)local_138,(bool)(local_19 & 1));
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::_List_const_iterator<ParamMeasure>::operator++(&local_100);
  }
  local_148 = (_List_node_base *)
              std::__cxx11::list<ParamMeasure,_std::allocator<ParamMeasure>_>::begin
                        (&this->OutputParamMeasures);
  local_100._M_node = local_148;
  while( true ) {
    pm_1 = (ParamMeasure *)
           std::__cxx11::list<ParamMeasure,_std::allocator<ParamMeasure>_>::end
                     (&this->OutputParamMeasures);
    bVar3 = std::operator!=(&local_100,(_Self *)&pm_1);
    if (!bVar3) break;
    local_158 = std::_List_const_iterator<ParamMeasure>::operator*(&local_100);
    std::operator<<(poStack_18,"  ");
    poVar2 = poStack_18;
    pPVar1 = local_158;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"output",&local_179);
    ParamMeasure::saveXml(pPVar1,poVar2,(string *)local_178,(bool)(local_19 & 1));
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::_List_const_iterator<ParamMeasure>::operator++(&local_100);
  }
  std::operator<<(poStack_18,"</parammeasures>");
  std::operator<<(poStack_18,"\n");
  return;
}

Assistant:

void ParamIDAnalysis::saveXml( ostream &s,bool moredetail ) const

{
  s << "<parammeasures";
  a_v( s, "name", fd->getName() );
  s << ">\n  ";
  fd->getAddress().saveXml( s );
  s << "\n  <proto";

  a_v(s,"model", fd->getFuncProto().getModelName());
  int4 extrapop = fd->getFuncProto().getExtraPop();
  if (extrapop == ProtoModel::extrapop_unknown)
    a_v(s,"extrapop","unknown");
  else
    a_v_i(s,"extrapop",extrapop);
  s << "/>\n";
  list<ParamMeasure>::const_iterator pm_iter;
  for( pm_iter = InputParamMeasures.begin(); pm_iter != InputParamMeasures.end(); ++pm_iter) {
    const ParamMeasure &pm( *pm_iter );
    s << "  ";
    pm.saveXml(s,"input",moredetail);
  }
  for( pm_iter = OutputParamMeasures.begin(); pm_iter != OutputParamMeasures.end() ; ++pm_iter) {
    const ParamMeasure &pm( *pm_iter );
    s << "  ";
    pm.saveXml( s, "output", moredetail );
  }
  s << "</parammeasures>";
  s << "\n";
}